

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_decompress.c
# Opt level: O2

size_t FSE_decompress_wksp_bmi2
                 (void *dst,size_t dstCapacity,void *cSrc,size_t cSrcSize,uint maxLog,
                 void *workSpace,size_t wkspSize,int bmi2)

{
  FSE_DTable *dt;
  uchar *puVar1;
  ulong uVar2;
  uchar *puVar3;
  uint uVar4;
  size_t sVar5;
  uchar uVar6;
  BIT_DStream_status BVar7;
  size_t sVar8;
  size_t sVar9;
  uchar *puVar10;
  long lVar11;
  FSE_DState_t *pFVar12;
  long lStack_b0;
  BIT_DStream_t bitD;
  uint maxSymbolValue;
  FSE_DState_t state1;
  uint tableLog;
  size_t local_48;
  FSE_DState_t local_40;
  
  maxSymbolValue = 0xff;
  if (wkspSize < 0x204) {
    sVar9 = 0xffffffffffffffff;
  }
  else {
    local_48 = dstCapacity;
    sVar8 = FSE_readNCount_bmi2((short *)workSpace,&maxSymbolValue,&tableLog,cSrc,cSrcSize,0);
    sVar9 = sVar8;
    if ((sVar8 < 0xffffffffffffff89) && (sVar9 = 0xffffffffffffffd4, tableLog <= maxLog)) {
      if (cSrcSize < sVar8) {
        __assert_fail("NCountLength <= cSrcSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/common/fse_decompress.c"
                      ,0x108,
                      "size_t FSE_decompress_wksp_body(void *, size_t, const void *, size_t, unsigned int, void *, size_t, int)"
                     );
      }
      lVar11 = (long)(1 << ((byte)tableLog & 0x1f));
      if (((1L << ((byte)tableLog & 0x3f)) + lVar11 * 4 + (ulong)(maxSymbolValue + 1) * 2 + 0x13 &
          0xfffffffffffffffc) + 0x204 <= wkspSize) {
        uVar2 = lVar11 * 4 + 0x208;
        if (wkspSize < uVar2) {
          __assert_fail("sizeof(*wksp) + FSE_DTABLE_SIZE(tableLog) <= wkspSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/common/fse_decompress.c"
                        ,0x10e,
                        "size_t FSE_decompress_wksp_body(void *, size_t, const void *, size_t, unsigned int, void *, size_t, int)"
                       );
        }
        dt = (FSE_DTable *)((long)workSpace + 0x200);
        sVar9 = FSE_buildDTable_internal
                          (dt,(short *)workSpace,maxSymbolValue,tableLog,
                           (void *)((long)workSpace + lVar11 * 4 + 0x208),wkspSize - uVar2);
        sVar5 = local_48;
        if (sVar9 < 0xffffffffffffff89) {
          puVar3 = (uchar *)((long)dst + (local_48 - 3));
          if (*(short *)((long)workSpace + 0x202) == 0) {
            sVar9 = BIT_initDStream(&bitD,(void *)((long)cSrc + sVar8),cSrcSize - sVar8);
            if (sVar9 < 0xffffffffffffff89) {
              FSE_initDState(&state1,&bitD,dt);
              pFVar12 = &local_40;
              FSE_initDState(pFVar12,&bitD,dt);
              lVar11 = 0;
              while (puVar10 = (uchar *)((long)dst + lVar11), bitD.bitsConsumed < 0x41) {
                if (bitD.ptr < bitD.limitPtr) {
                  if (bitD.ptr == bitD.start) break;
                  uVar4 = (int)bitD.ptr - (int)bitD.start;
                  if (bitD.ptr + -(ulong)(bitD.bitsConsumed >> 3) >= bitD.start) {
                    uVar4 = bitD.bitsConsumed >> 3;
                  }
                  BVar7 = (BIT_DStream_status)
                          (bitD.ptr + -(ulong)(bitD.bitsConsumed >> 3) < bitD.start);
                  bitD.ptr = bitD.ptr + -(ulong)uVar4;
                  bitD.bitsConsumed = bitD.bitsConsumed + uVar4 * -8;
                  bitD.bitContainer = *(size_t *)bitD.ptr;
                }
                else {
                  BVar7 = BIT_reloadDStreamFast(&bitD);
                }
                if ((puVar3 <= puVar10) || (BVar7 != BIT_DStream_unfinished)) break;
                uVar6 = FSE_decodeSymbol(&state1,&bitD);
                *(uchar *)((long)dst + lVar11) = uVar6;
                uVar6 = FSE_decodeSymbol(pFVar12,&bitD);
                *(uchar *)((long)dst + lVar11 + 1) = uVar6;
                uVar6 = FSE_decodeSymbol(&state1,&bitD);
                *(uchar *)((long)dst + lVar11 + 2) = uVar6;
                uVar6 = FSE_decodeSymbol(pFVar12,&bitD);
                *(uchar *)((long)dst + lVar11 + 3) = uVar6;
                lVar11 = lVar11 + 4;
              }
              puVar3 = (uchar *)((long)dst + (sVar5 - 2));
              for (; sVar9 = 0xffffffffffffffba, (uchar *)((long)dst + lVar11) <= puVar3;
                  lVar11 = lVar11 + 2) {
                uVar6 = FSE_decodeSymbol(&state1,&bitD);
                *(uchar *)((long)dst + lVar11) = uVar6;
                if (0x40 < bitD.bitsConsumed) {
                  puVar10 = (uchar *)((long)dst + lVar11);
LAB_005f480c:
                  puVar10 = puVar10 + 1;
                  lStack_b0 = 2;
LAB_005f481f:
                  uVar6 = FSE_decodeSymbol(pFVar12,&bitD);
                  goto LAB_005f482e;
                }
                if (bitD.ptr < bitD.limitPtr) {
                  if (bitD.ptr != bitD.start) {
                    uVar4 = (int)bitD.ptr - (int)bitD.start;
                    if (bitD.start <= bitD.ptr + -(ulong)(bitD.bitsConsumed >> 3)) {
                      uVar4 = bitD.bitsConsumed >> 3;
                    }
                    bitD.ptr = bitD.ptr + -(ulong)uVar4;
                    bitD.bitsConsumed = bitD.bitsConsumed + uVar4 * -8;
                    bitD.bitContainer = *(size_t *)bitD.ptr;
                  }
                }
                else {
                  BVar7 = BIT_reloadDStreamFast(&bitD);
                  if (BVar7 == BIT_DStream_overflow) goto LAB_005f480c;
                }
                puVar1 = (uchar *)((long)dst + lVar11 + 1);
                if (puVar3 < puVar1) {
                  return 0xffffffffffffffba;
                }
                uVar6 = FSE_decodeSymbol(pFVar12,&bitD);
                puVar10 = puVar10 + 2;
                *puVar1 = uVar6;
                if (0x40 < bitD.bitsConsumed) {
LAB_005f4818:
                  pFVar12 = &state1;
                  lStack_b0 = 3;
                  goto LAB_005f481f;
                }
                if (bitD.ptr < bitD.limitPtr) {
                  if (bitD.ptr != bitD.start) {
                    uVar4 = (int)bitD.ptr - (int)bitD.start;
                    if (bitD.start <= bitD.ptr + -(ulong)(bitD.bitsConsumed >> 3)) {
                      uVar4 = bitD.bitsConsumed >> 3;
                    }
                    bitD.ptr = bitD.ptr + -(ulong)uVar4;
                    bitD.bitsConsumed = bitD.bitsConsumed + uVar4 * -8;
                    bitD.bitContainer = *(size_t *)bitD.ptr;
                  }
                }
                else {
                  BVar7 = BIT_reloadDStreamFast(&bitD);
                  if (BVar7 == BIT_DStream_overflow) {
                    puVar10 = (uchar *)((long)dst + lVar11 + 2);
                    goto LAB_005f4818;
                  }
                }
              }
            }
          }
          else {
            sVar9 = BIT_initDStream(&bitD,(void *)((long)cSrc + sVar8),cSrcSize - sVar8);
            if (sVar9 < 0xffffffffffffff89) {
              FSE_initDState(&state1,&bitD,dt);
              pFVar12 = &local_40;
              FSE_initDState(pFVar12,&bitD,dt);
              lVar11 = 0;
              while (puVar10 = (uchar *)((long)dst + lVar11), bitD.bitsConsumed < 0x41) {
                if (bitD.ptr < bitD.limitPtr) {
                  if (bitD.ptr == bitD.start) break;
                  uVar4 = (int)bitD.ptr - (int)bitD.start;
                  if (bitD.ptr + -(ulong)(bitD.bitsConsumed >> 3) >= bitD.start) {
                    uVar4 = bitD.bitsConsumed >> 3;
                  }
                  BVar7 = (BIT_DStream_status)
                          (bitD.ptr + -(ulong)(bitD.bitsConsumed >> 3) < bitD.start);
                  bitD.ptr = bitD.ptr + -(ulong)uVar4;
                  bitD.bitsConsumed = bitD.bitsConsumed + uVar4 * -8;
                  bitD.bitContainer = *(size_t *)bitD.ptr;
                }
                else {
                  BVar7 = BIT_reloadDStreamFast(&bitD);
                }
                if ((puVar3 <= puVar10) || (BVar7 != BIT_DStream_unfinished)) break;
                uVar6 = FSE_decodeSymbolFast(&state1,&bitD);
                *(uchar *)((long)dst + lVar11) = uVar6;
                uVar6 = FSE_decodeSymbolFast(pFVar12,&bitD);
                *(uchar *)((long)dst + lVar11 + 1) = uVar6;
                uVar6 = FSE_decodeSymbolFast(&state1,&bitD);
                *(uchar *)((long)dst + lVar11 + 2) = uVar6;
                uVar6 = FSE_decodeSymbolFast(pFVar12,&bitD);
                *(uchar *)((long)dst + lVar11 + 3) = uVar6;
                lVar11 = lVar11 + 4;
              }
              puVar3 = (uchar *)((long)dst + (sVar5 - 2));
              for (; sVar9 = 0xffffffffffffffba, (uchar *)((long)dst + lVar11) <= puVar3;
                  lVar11 = lVar11 + 2) {
                uVar6 = FSE_decodeSymbolFast(&state1,&bitD);
                *(uchar *)((long)dst + lVar11) = uVar6;
                if (0x40 < bitD.bitsConsumed) {
                  puVar10 = (uchar *)((long)dst + lVar11);
LAB_005f47e5:
                  puVar10 = puVar10 + 1;
                  lStack_b0 = 2;
                  goto LAB_005f47f8;
                }
                if (bitD.ptr < bitD.limitPtr) {
                  if (bitD.ptr != bitD.start) {
                    uVar4 = (int)bitD.ptr - (int)bitD.start;
                    if (bitD.start <= bitD.ptr + -(ulong)(bitD.bitsConsumed >> 3)) {
                      uVar4 = bitD.bitsConsumed >> 3;
                    }
                    bitD.ptr = bitD.ptr + -(ulong)uVar4;
                    bitD.bitsConsumed = bitD.bitsConsumed + uVar4 * -8;
                    bitD.bitContainer = *(size_t *)bitD.ptr;
                  }
                }
                else {
                  BVar7 = BIT_reloadDStreamFast(&bitD);
                  if (BVar7 == BIT_DStream_overflow) goto LAB_005f47e5;
                }
                puVar1 = (uchar *)((long)dst + lVar11 + 1);
                if (puVar3 < puVar1) {
                  return 0xffffffffffffffba;
                }
                uVar6 = FSE_decodeSymbolFast(pFVar12,&bitD);
                puVar10 = puVar10 + 2;
                *puVar1 = uVar6;
                if (0x40 < bitD.bitsConsumed) {
LAB_005f47f1:
                  pFVar12 = &state1;
                  lStack_b0 = 3;
LAB_005f47f8:
                  uVar6 = FSE_decodeSymbolFast(pFVar12,&bitD);
LAB_005f482e:
                  *puVar10 = uVar6;
                  return lStack_b0 + lVar11;
                }
                if (bitD.ptr < bitD.limitPtr) {
                  if (bitD.ptr != bitD.start) {
                    uVar4 = (int)bitD.ptr - (int)bitD.start;
                    if (bitD.start <= bitD.ptr + -(ulong)(bitD.bitsConsumed >> 3)) {
                      uVar4 = bitD.bitsConsumed >> 3;
                    }
                    bitD.ptr = bitD.ptr + -(ulong)uVar4;
                    bitD.bitsConsumed = bitD.bitsConsumed + uVar4 * -8;
                    bitD.bitContainer = *(size_t *)bitD.ptr;
                  }
                }
                else {
                  BVar7 = BIT_reloadDStreamFast(&bitD);
                  if (BVar7 == BIT_DStream_overflow) {
                    puVar10 = (uchar *)((long)dst + lVar11 + 2);
                    goto LAB_005f47f1;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return sVar9;
}

Assistant:

size_t FSE_decompress_wksp_bmi2(void* dst, size_t dstCapacity, const void* cSrc, size_t cSrcSize, unsigned maxLog, void* workSpace, size_t wkspSize, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        return FSE_decompress_wksp_body_bmi2(dst, dstCapacity, cSrc, cSrcSize, maxLog, workSpace, wkspSize);
    }
#endif
    (void)bmi2;
    return FSE_decompress_wksp_body_default(dst, dstCapacity, cSrc, cSrcSize, maxLog, workSpace, wkspSize);
}